

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::scoped_padder::scoped_padder
          (scoped_padder *this,size_t wrapped_size,padding_info *padinfo,memory_buf_t *dest)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  
  this->padinfo_ = padinfo;
  this->dest_ = dest;
  (this->spaces_).data_ = "                                                                ";
  (this->spaces_).size_ = 0x40;
  sVar1 = padinfo->width_;
  uVar2 = sVar1 - wrapped_size;
  this->remaining_pad_ = uVar2;
  if (uVar2 != 0 && (long)wrapped_size <= (long)sVar1) {
    if (padinfo->side_ == center) {
      fmt::v11::detail::buffer<char>::append<char>
                (&dest->super_buffer<char>,
                 "                                                                ",
                 "                                                                " + (uVar2 >> 1));
      lVar3 = (ulong)((uint)uVar2 & 1) + (uVar2 >> 1);
    }
    else {
      if (padinfo->side_ != left) {
        return;
      }
      fmt::v11::detail::buffer<char>::append<char>
                (&dest->super_buffer<char>,
                 "                                                                ",
                 "                                                                " + uVar2);
      lVar3 = 0;
    }
    this->remaining_pad_ = lVar3;
  }
  return;
}

Assistant:

scoped_padder(size_t wrapped_size, const padding_info &padinfo, memory_buf_t &dest)
        : padinfo_(padinfo),
          dest_(dest) {
        remaining_pad_ = static_cast<long>(padinfo.width_) - static_cast<long>(wrapped_size);
        if (remaining_pad_ <= 0) {
            return;
        }

        if (padinfo_.side_ == padding_info::pad_side::left) {
            pad_it(remaining_pad_);
            remaining_pad_ = 0;
        } else if (padinfo_.side_ == padding_info::pad_side::center) {
            auto half_pad = remaining_pad_ / 2;
            auto reminder = remaining_pad_ & 1;
            pad_it(half_pad);
            remaining_pad_ = half_pad + reminder;  // for the right side
        }
    }